

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_set_(map_base_t *m,char *key,void *value,int vsize)

{
  int iVar1;
  map_node_t **ppmVar2;
  map_node_t *node_00;
  int local_4c;
  map_node_t *node;
  map_node_t **next;
  int err;
  int n;
  int vsize_local;
  void *value_local;
  char *key_local;
  map_base_t *m_local;
  
  ppmVar2 = map_getref(m,key);
  if (ppmVar2 != (map_node_t **)0x0) {
    memcpy((*ppmVar2)->value,value,(long)vsize);
    return 0;
  }
  node_00 = map_newnode(key,value,vsize);
  if (node_00 == (map_node_t *)0x0) {
LAB_00102ab4:
    if (node_00 != (map_node_t *)0x0) {
      free(node_00);
    }
    m_local._4_4_ = -1;
  }
  else {
    if (m->nbuckets <= m->nnodes) {
      if (m->nbuckets == 0) {
        local_4c = 1;
      }
      else {
        local_4c = m->nbuckets << 1;
      }
      iVar1 = map_resize(m,local_4c);
      if (iVar1 != 0) goto LAB_00102ab4;
    }
    map_addnode(m,node_00);
    m->nnodes = m->nnodes + 1;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) free(node);
  return -1;
}